

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

int __thiscall Node::IsLogical(Node *this)

{
  int iVar1;
  
  for (; iVar1 = this->Type, iVar1 == 0x28; this = this->Tree[0]) {
  }
  if ((5 < iVar1 - 0x1e2U) && (2 < iVar1 - 0x3cU)) {
    return 0;
  }
  return 1;
}

Assistant:

int Node::IsLogical(void)
{
	switch(Type)
	{
	case '<':
	case '>':
	case BAS_X_NEQ:
	case BAS_X_GE:
	case BAS_X_LE:
	case '=':
	case BAS_X_LNOT:
	case BAS_X_LAND:
	case BAS_X_LOR:
		//
		// logical operations
		//
		return 1;

	case '(':
		//
		// Look beneath the skin
		//
		return Tree[0]->IsLogical();

	default:
		//
		// By default, things are not logical
		//
		return 0;
	}
}